

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINChecksum.cpp
# Opt level: O0

U8 __thiscall LINChecksum::add(LINChecksum *this,U8 byte)

{
  U8 byte_local;
  LINChecksum *this_local;
  
  this->mChecksum = this->mChecksum + (ushort)byte;
  if (0xff < this->mChecksum) {
    this->mChecksum = this->mChecksum - 0xff;
  }
  return (U8)this->mChecksum;
}

Assistant:

U8 LINChecksum::add( U8 byte )
{
    mChecksum += byte;
    if( mChecksum >= 256 )
        mChecksum -= 255;

    // if ( mChecksum & 0x100 ) // carry?
    //	mChecksum += 1;
    return ( U8 )( mChecksum & 0xFF );
}